

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O0

value_type_conflict3
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::StoreT<long>,long>(long *in)

{
  string_view tag_00;
  cx_string<1UL> cVar1;
  long lVar2;
  string_view sVar3;
  cx_string<1UL> tag;
  InputStream istream;
  StoreT<long> visitor;
  OutputStream ostream;
  stringstream stream;
  OutputStream *in_stack_fffffffffffffe08;
  long *in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe38;
  long *plVar4;
  StoreT<long> local_1b8;
  long *local_1a8;
  long local_190 [2];
  StoreT<long> *in_stack_fffffffffffffe80;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_190);
  std::ios::exceptions((int)local_190 + (int)*(undefined8 *)(local_190[0] + -0x18));
  local_1a8 = local_190;
  mserialize::serialize<long,OutputStream>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  anon_unknown.dwarf_ae198::StoreT<long>::StoreT(&local_1b8);
  plVar4 = local_190;
  cVar1 = mserialize::tag<long>();
  sVar3 = mserialize::cx_string::operator_cast_to_string_view((cx_string<1UL> *)0x1b6235);
  tag_00._ptr._6_1_ = cVar1._data[0];
  tag_00._ptr._7_1_ = cVar1._data[1];
  tag_00._ptr._0_6_ = in_stack_fffffffffffffe38;
  tag_00._len = (size_t)plVar4;
  mserialize::visit<(anonymous_namespace)::StoreT<long>,InputStream>
            (tag_00,(StoreT<long> *)sVar3._len,(InputStream *)sVar3._ptr);
  lVar2 = anon_unknown.dwarf_ae198::StoreT<long>::value(in_stack_fffffffffffffe80);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  return lVar2;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}